

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNotationImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMNotationImpl::setBaseURI(DOMNotationImpl *this,XMLCh *baseURI)

{
  int iVar1;
  undefined4 extraout_var;
  XMLSize_t XVar2;
  XMLCh *target;
  long *local_38;
  XMLCh *temp;
  XMLCh *baseURI_local;
  DOMNotationImpl *this_local;
  
  if ((baseURI == (XMLCh *)0x0) || (*baseURI == L'\0')) {
    this->fBaseURI = (XMLCh *)0x0;
  }
  else {
    iVar1 = (*(this->super_DOMNotation).super_DOMNode._vptr_DOMNode[0xc])();
    if (CONCAT44(extraout_var,iVar1) == 0) {
      local_38 = (long *)0x0;
    }
    else {
      local_38 = (long *)(CONCAT44(extraout_var,iVar1) + -8);
    }
    XVar2 = XMLString::stringLen(baseURI);
    target = (XMLCh *)(**(code **)(*local_38 + 0x20))(local_38,(XVar2 + 9) * 2);
    XMLString::fixURI(baseURI,target);
    this->fBaseURI = target;
  }
  return;
}

Assistant:

void DOMNotationImpl::setBaseURI(const XMLCh* baseURI) {
    if (baseURI && *baseURI) {
        XMLCh* temp = (XMLCh*) ((DOMDocumentImpl *)getOwnerDocument())->allocate((XMLString::stringLen(baseURI) + 9)*sizeof(XMLCh));
        XMLString::fixURI(baseURI, temp);
        fBaseURI = temp;
    }
    else
        fBaseURI = 0;
}